

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender __thiscall
fmt::v9::detail::write_nonfinite<char,fmt::v9::appender>
          (detail *this,appender out,bool isnan,basic_format_specs<char> specs,float_specs *fspecs)

{
  uint uVar1;
  appender aVar2;
  size_t size;
  undefined7 in_register_00000011;
  char *pcVar3;
  bool bVar4;
  basic_format_specs<char> local_20;
  anon_class_16_2_632e021f local_10;
  
  local_20._1_7_ = in_register_00000011;
  local_20.width._0_1_ = isnan;
  local_20._8_8_ = specs._0_8_;
  uVar1 = *(uint *)(specs._8_8_ + 4);
  if ((local_20._8_8_ & 0xff000000ff000000) == 0x100000030000000) {
    local_20.fill._1_4_ = specs.precision;
    local_20._8_3_ = specs.width._0_3_;
    local_20.fill.data_[0] = ' ';
  }
  bVar4 = (uVar1 >> 0x10 & 1) == 0;
  pcVar3 = "NAN";
  if (bVar4) {
    pcVar3 = "nan";
  }
  local_10.str = "INF";
  if (bVar4) {
    local_10.str = "inf";
  }
  if ((char)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container != '\0') {
    local_10.str = pcVar3;
  }
  local_10.sign = (sign_t)(uVar1 >> 8);
  size = 4 - (ulong)(local_10.sign == none);
  aVar2 = write_padded<(fmt::v9::align::type)1,fmt::v9::appender,char,fmt::v9::detail::write_nonfinite<char,fmt::v9::appender>(fmt::v9::appender,bool,fmt::v9::basic_format_specs<char>,fmt::v9::detail::float_specs_const&)::_lambda(fmt::v9::appender)_1_&>
                    ((appender)this,&local_20,size,size,&local_10);
  return (appender)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_nonfinite(OutputIt out, bool isnan,
                                     basic_format_specs<Char> specs,
                                     const float_specs& fspecs) -> OutputIt {
  auto str =
      isnan ? (fspecs.upper ? "NAN" : "nan") : (fspecs.upper ? "INF" : "inf");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  // Replace '0'-padding with space for non-finite values.
  const bool is_zero_fill =
      specs.fill.size() == 1 && *specs.fill.data() == static_cast<Char>('0');
  if (is_zero_fill) specs.fill[0] = static_cast<Char>(' ');
  return write_padded(out, specs, size, [=](reserve_iterator<OutputIt> it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    return copy_str<Char>(str, str + str_size, it);
  });
}